

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsXYZnode.h
# Opt level: O1

ChLoadXYZnodeXYZnodeSpring * __thiscall
chrono::ChLoadXYZnodeXYZnodeSpring::Clone(ChLoadXYZnodeXYZnodeSpring *this)

{
  double dVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  ChLoadXYZnodeXYZnodeSpring *this_00;
  
  this_00 = (ChLoadXYZnodeXYZnodeSpring *)::operator_new(0xa0);
  ChObj::ChObj((ChObj *)this_00,(ChObj *)this);
  (this_00->super_ChLoadXYZnodeXYZnode).super_ChLoadCustomMultiple.super_ChLoadBase.super_ChObj.
  _vptr_ChObj = (_func_int **)&PTR__ChLoadBase_00b48a58;
  (this_00->super_ChLoadXYZnodeXYZnode).super_ChLoadCustomMultiple.super_ChLoadBase.jacobians =
       (this->super_ChLoadXYZnodeXYZnode).super_ChLoadCustomMultiple.super_ChLoadBase.jacobians;
  (this_00->super_ChLoadXYZnodeXYZnode).super_ChLoadCustomMultiple.super_ChLoadBase.super_ChObj.
  _vptr_ChObj = (_func_int **)&PTR__ChLoadCustomMultiple_00b48bd0;
  std::
  vector<std::shared_ptr<chrono::ChLoadable>,_std::allocator<std::shared_ptr<chrono::ChLoadable>_>_>
  ::vector(&(this_00->super_ChLoadXYZnodeXYZnode).super_ChLoadCustomMultiple.loadables,
           &(this->super_ChLoadXYZnodeXYZnode).super_ChLoadCustomMultiple.loadables);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)
             &(this_00->super_ChLoadXYZnodeXYZnode).super_ChLoadCustomMultiple.load_Q,
             (DenseStorage<double,__1,__1,_1,_0> *)
             &(this->super_ChLoadXYZnodeXYZnode).super_ChLoadCustomMultiple.load_Q);
  (this_00->super_ChLoadXYZnodeXYZnode).super_ChLoadCustomMultiple.super_ChLoadBase.super_ChObj.
  _vptr_ChObj = (_func_int **)&PTR__ChLoadCustomMultiple_00b49630;
  (this_00->super_ChLoadXYZnodeXYZnode).computed_abs_force.m_data[0] =
       (this->super_ChLoadXYZnodeXYZnode).computed_abs_force.m_data[0];
  (this_00->super_ChLoadXYZnodeXYZnode).computed_abs_force.m_data[1] =
       (this->super_ChLoadXYZnodeXYZnode).computed_abs_force.m_data[1];
  (this_00->super_ChLoadXYZnodeXYZnode).computed_abs_force.m_data[2] =
       (this->super_ChLoadXYZnodeXYZnode).computed_abs_force.m_data[2];
  (this_00->super_ChLoadXYZnodeXYZnode).super_ChLoadCustomMultiple.super_ChLoadBase.super_ChObj.
  _vptr_ChObj = (_func_int **)&PTR__ChLoadCustomMultiple_00b496f8;
  dVar1 = this->R;
  uVar2 = *(undefined8 *)((long)&this->R + 1);
  uVar3 = *(undefined8 *)((long)&this->d_0 + 1);
  this_00->K = this->K;
  this_00->R = dVar1;
  *(undefined8 *)((long)&this_00->R + 1) = uVar2;
  *(undefined8 *)((long)&this_00->d_0 + 1) = uVar3;
  return this_00;
}

Assistant:

virtual ChLoadXYZnodeXYZnodeSpring* Clone() const override { return new ChLoadXYZnodeXYZnodeSpring(*this); }